

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

void __thiscall pbrt::GammaColorEncoding::GammaColorEncoding(GammaColorEncoding *this,Float gamma)

{
  float *pfVar1;
  size_t sVar2;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  double dVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  Float v_1;
  int i_1;
  Float v;
  int i;
  int local_18;
  int local_10;
  undefined1 extraout_var [56];
  
  *in_RDI = in_XMM0_Da;
  pstd::array<float,_256>::array((array<float,_256> *)(in_RDI + 1));
  pstd::array<float,_1024>::array((array<float,_1024> *)(in_RDI + 0x101));
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    in_ZMM1 = ZEXT464((uint)in_XMM0_Da);
    dVar4 = std::pow((double)(ulong)(uint)((float)local_10 / 255.0),(double)(ulong)(uint)in_XMM0_Da)
    ;
    pfVar1 = pstd::array<float,_256>::operator[]((array<float,_256> *)(in_RDI + 1),(long)local_10);
    *pfVar1 = SUB84(dVar4,0);
  }
  local_18 = 0;
  while( true ) {
    auVar6 = in_ZMM1._0_16_;
    sVar2 = pstd::array<float,_1024>::size((array<float,_1024> *)(in_RDI + 0x101));
    if ((int)sVar2 <= local_18) break;
    sVar2 = pstd::array<float,_1024>::size((array<float,_1024> *)(in_RDI + 0x101));
    auVar6 = vcvtusi2ss_avx512f(auVar6,sVar2 - 1);
    auVar7._0_4_ = 1.0 / in_XMM0_Da;
    auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar5._0_8_ = std::pow((double)(ulong)(uint)((float)local_18 / auVar6._0_4_),auVar7._0_8_);
    auVar5._8_56_ = extraout_var;
    in_ZMM1 = ZEXT1664(auVar5._0_16_);
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar5._0_16_,
                             SUB6416(ZEXT464(0x3f000000),0));
    fVar3 = Clamp<float,int,int>(auVar6._0_4_,0,0xff);
    pfVar1 = pstd::array<float,_1024>::operator[]
                       ((array<float,_1024> *)(in_RDI + 0x101),(long)local_18);
    *pfVar1 = fVar3;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

GammaColorEncoding::GammaColorEncoding(Float gamma) : gamma(gamma) {
    for (int i = 0; i < 256; ++i) {
        Float v = Float(i) / 255.f;
        applyLUT[i] = std::pow(v, gamma);
    }
    for (int i = 0; i < int(inverseLUT.size()); ++i) {
        Float v = Float(i) / Float(inverseLUT.size() - 1);
        inverseLUT[i] = Clamp(255.f * std::pow(v, 1.f / gamma) + .5f, 0, 255);
    }
}